

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsIntMapCopy(FmsIntType src_type,void *src,FmsIntType dst_type,void *dst,void *map,FmsInt size)

{
  int iVar1;
  
  iVar1 = (*(code *)(&DAT_00112320 + *(int *)(&DAT_00112320 + (ulong)src_type * 4)))();
  return iVar1;
}

Assistant:

static int FmsIntMapCopy(FmsIntType src_type, const void *src,
                         FmsIntType dst_type, void *dst, const void *map,
                         FmsInt size) {
  if (src_type >= FMS_NUM_INT_TYPES || dst_type >= FMS_NUM_INT_TYPES) {
    E_RETURN(1);
  }
  switch (dst_type) {
  case FMS_INT8:   FMS_IMC_SW(src_type,src,  int8_t,dst,map,size);
  case FMS_INT16:  FMS_IMC_SW(src_type,src, int16_t,dst,map,size);
  case FMS_INT32:  FMS_IMC_SW(src_type,src, int32_t,dst,map,size);
  case FMS_INT64:  FMS_IMC_SW(src_type,src, int64_t,dst,map,size);
  case FMS_UINT8:  FMS_IMC_SW(src_type,src, uint8_t,dst,map,size);
  case FMS_UINT16: FMS_IMC_SW(src_type,src,uint16_t,dst,map,size);
  case FMS_UINT32: FMS_IMC_SW(src_type,src,uint32_t,dst,map,size);
  case FMS_UINT64: FMS_IMC_SW(src_type,src,uint64_t,dst,map,size);
  default: FmsAbortNotImplemented();
  }
  return 0;
}